

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O1

ostream * __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::dump_node(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            *this,ostream *os,size_t N,size_t depth,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *clrs)

{
  pointer pbVar1;
  stored_size_type sVar2;
  pointer ppVar3;
  undefined8 uVar4;
  ulong uVar5;
  size_t depth_00;
  char *__end;
  pointer prVar6;
  long lVar7;
  long lVar8;
  string local_90;
  pointer local_70;
  long local_68;
  size_t local_60;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *local_58;
  string local_50;
  
  uVar5 = depth % 3;
  pbVar1 = (clrs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(clrs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5) {
    uVar4 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    _Unwind_Resume(uVar4);
  }
  local_60 = depth;
  if ((this->tree_).m_holder.m_size <= N) {
LAB_001076ea:
    boost::container::throw_out_of_range("vector::at out of range");
  }
  prVar6 = (this->tree_).m_holder.m_start + N;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"none","");
  local_58 = &this->boundary_;
  to_svg<char,std::char_traits<char>,perior::point<double,2ul>>
            (os,&prVar6->box,local_58,pbVar1 + uVar5,1,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_90,1);
  sVar2 = (prVar6->entry).
          super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          .m_holder.m_size;
  lVar7 = sVar2 * 8;
  local_70 = prVar6;
  local_68 = lVar7;
  if (prVar6->is_leaf == true) {
    if (sVar2 != 0) {
      lVar7 = 0;
      do {
        uVar5 = *(ulong *)((long)(local_70->box).center.values_.elems + lVar7 + -0x38);
        if ((this->container_).m_holder.m_size <= uVar5) goto LAB_001076ea;
        ppVar3 = (this->container_).m_holder.m_start;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"black","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"black","");
        to_svg<char,std::char_traits<char>,perior::point<double,2ul>>
                  (os,&ppVar3[uVar5].first,local_58,&local_90,1,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        local_90._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_90,1);
        lVar7 = lVar7 + 8;
      } while (local_68 != lVar7);
    }
  }
  else if (sVar2 != 0) {
    depth_00 = local_60 + 1;
    lVar8 = 0;
    do {
      dump_node(this,os,*(size_t *)((long)(prVar6->box).center.values_.elems + lVar8 + -0x38),
                depth_00,clrs);
      lVar8 = lVar8 + 8;
    } while (lVar7 != lVar8);
  }
  return os;
}

Assistant:

std::ostream& dump_node(std::ostream& os,
              const std::size_t N, const std::size_t depth,
              const std::vector<std::string>& clrs) const
    {
        const std::string& clr = clrs.at(depth % 3);
        const node_type& node = tree_.at(N);
        to_svg(os, node.box, this->boundary_, clr, 1, "none");
        os << '\n';
        if(node.is_leaf)
        {
            for(typename node_type::const_iterator
                    i(node.entry.cbegin()), e(node.entry.cend()); i!=e; ++i)
            {
                to_svg(os, indexable_getter_(this->container_.at(*i)),
                       this->boundary_, "black", 1, "black");
                os << '\n';
            }
            return os;
        }
        else // internal node
        {
            for(typename node_type::const_iterator
                    i(node.entry.cbegin()), e(node.entry.cend()); i!=e; ++i)
            {
                this->dump_node(os, *i, depth+1, clrs);
            }
            return os;
        }
    }